

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_hmac.c
# Opt level: O3

int csp_hmac_append(csp_packet_t *packet,_Bool include_header)

{
  ushort uVar1;
  int iVar2;
  uint8_t hmac [20];
  undefined4 local_28 [6];
  
  iVar2 = -1;
  if (packet->length < 0xfd) {
    if (include_header) {
      csp_hmac_memory(csp_hmac_key,0x10,packet->frame_begin,(uint)packet->frame_length,
                      (uint8_t *)local_28);
      *(undefined4 *)(packet->frame_begin + packet->frame_length) = local_28[0];
      packet->frame_length = packet->frame_length + 4;
      uVar1 = packet->length;
    }
    else {
      csp_hmac_memory(csp_hmac_key,0x10,&packet->field_12,(uint)packet->length,(uint8_t *)local_28);
      uVar1 = packet->length;
      *(undefined4 *)(packet->header + (ulong)uVar1 + 8) = local_28[0];
    }
    packet->length = uVar1 + 4;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int csp_hmac_append(csp_packet_t * packet, bool include_header) {

	if ((packet->length + (unsigned int)CSP_HMAC_LENGTH) > sizeof(packet->data)) {
		return CSP_ERR_NOMEM;
	}

	/* Calculate HMAC */
	uint8_t hmac[CSP_SHA1_DIGESTSIZE];

	if (include_header) {

		/* If header is included, csp_id_prepend() must be called beforehand */
		csp_hmac_memory(csp_hmac_key, sizeof(csp_hmac_key), packet->frame_begin, packet->frame_length, hmac);
		memcpy(&packet->frame_begin[packet->frame_length], hmac, CSP_HMAC_LENGTH);
		packet->frame_length += CSP_HMAC_LENGTH;
		packet->length += CSP_HMAC_LENGTH;

	} else {

		csp_hmac_memory(csp_hmac_key, sizeof(csp_hmac_key), packet->data, packet->length, hmac);
		memcpy(&packet->data[packet->length], hmac, CSP_HMAC_LENGTH);
		packet->length += CSP_HMAC_LENGTH;
	}

	return CSP_ERR_NONE;
}